

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::StructPackingPass::assignStructMemberOffsets
          (StructPackingPass *this,uint32_t structIdToPack,
          vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          *structMemberTypes)

{
  uint32_t uVar1;
  bool bVar2;
  IRContext *pIVar3;
  Instruction *pIVar4;
  Operand *pOVar5;
  uint *puVar6;
  const_reference ppTVar7;
  bool local_75;
  uint local_64;
  uint32_t alignment;
  uint32_t local_5c;
  uint32_t packedSize;
  uint32_t packedAlignment;
  Type *memberType;
  uint32_t memberIndex;
  uint32_t padAlignment;
  uint32_t currentOffset;
  uint32_t prevMemberIndex;
  inst_iterator itEnd;
  inst_iterator it;
  bool modified;
  anon_class_4_1_b8b55562 isMemberOffsetDecoration;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *structMemberTypes_local;
  uint32_t structIdToPack_local;
  StructPackingPass *this_local;
  
  it.super_iterator.node_._3_1_ = 0;
  it.super_iterator.node_._4_4_ = structIdToPack;
  pIVar3 = Pass::context(&this->super_Pass);
  IRContext::module(pIVar3);
  Module::annotation_begin((Module *)&itEnd);
  pIVar3 = Pass::context(&this->super_Pass);
  IRContext::module(pIVar3);
  Module::annotation_end((Module *)&currentOffset);
  while( true ) {
    bVar2 = utils::operator!=(&itEnd.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&currentOffset);
    if (!bVar2) goto LAB_0025ec92;
    pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*(&itEnd.super_iterator);
    bVar2 = assignStructMemberOffsets::anon_class_4_1_b8b55562::operator()
                      ((anon_class_4_1_b8b55562 *)((long)&it.super_iterator.node_ + 4),pIVar4);
    if (bVar2) break;
    InstructionList::iterator::operator++(&itEnd);
  }
  padAlignment = 0;
  memberIndex = 0;
  memberType._4_4_ = 1;
  do {
    pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->(&itEnd.super_iterator);
    pOVar5 = Instruction::GetOperand(pIVar4,1);
    puVar6 = utils::SmallVector<unsigned_int,_2UL>::operator[](&pOVar5->words,0);
    memberType._0_4_ = *puVar6;
    if ((uint)memberType < padAlignment) {
      return Failure;
    }
    ppTVar7 = std::
              vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ::operator[](structMemberTypes,(ulong)(uint)memberType);
    _packedSize = *ppTVar7;
    local_5c = getPackedAlignment(this,_packedSize);
    alignment = getPackedSize(this,_packedSize);
    bVar2 = isPackingHlsl(this->packingRules_);
    if ((bVar2) && (memberIndex >> 4 != (memberIndex + alignment) - 1 >> 4)) {
      local_64 = 0x10;
      puVar6 = std::max<unsigned_int>(&local_5c,&local_64);
      local_5c = *puVar6;
    }
    puVar6 = std::max<unsigned_int>(&local_5c,(uint *)((long)&memberType + 4));
    memberIndex = alignPow2(memberIndex,*puVar6);
    memberType._4_4_ = getPadAlignment(_packedSize,local_5c);
    pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->(&itEnd.super_iterator);
    pOVar5 = Instruction::GetOperand(pIVar4,3);
    puVar6 = utils::SmallVector<unsigned_int,_2UL>::operator[](&pOVar5->words,0);
    uVar1 = memberIndex;
    if (*puVar6 < memberIndex) {
      return Failure;
    }
    pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->(&itEnd.super_iterator);
    pOVar5 = Instruction::GetOperand(pIVar4,3);
    puVar6 = utils::SmallVector<unsigned_int,_2UL>::operator[](&pOVar5->words,0);
    *puVar6 = uVar1;
    it.super_iterator.node_._3_1_ = 1;
    InstructionList::iterator::operator++(&itEnd);
    padAlignment = (uint)memberType;
    memberIndex = alignment + memberIndex;
    bVar2 = utils::operator!=(&itEnd.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&currentOffset);
    local_75 = false;
    if (bVar2) {
      pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*(&itEnd.super_iterator);
      local_75 = assignStructMemberOffsets::anon_class_4_1_b8b55562::operator()
                           ((anon_class_4_1_b8b55562 *)((long)&it.super_iterator.node_ + 4),pIVar4);
    }
  } while (local_75 != false);
LAB_0025ec92:
  this_local._4_4_ = SuccessWithoutChange;
  if ((it.super_iterator.node_._3_1_ & 1) != 0) {
    this_local._4_4_ = SuccessWithChange;
  }
  return this_local._4_4_;
}

Assistant:

Pass::Status StructPackingPass::assignStructMemberOffsets(
    uint32_t structIdToPack,
    const std::vector<const analysis::Type*>& structMemberTypes) {
  // Returns true if the specified instruction is a OpMemberDecorate for the
  // struct we're looking for with an offset decoration
  auto isMemberOffsetDecoration =
      [structIdToPack](const Instruction& instr) -> bool {
    return instr.opcode() == spv::Op::OpMemberDecorate &&
           instr.GetOperand(0).AsId() == structIdToPack &&
           static_cast<spv::Decoration>(instr.GetOperand(2).words[0]) ==
               spv::Decoration::Offset;
  };

  bool modified = false;

  // Find and re-assign all member offset decorations
  for (auto it = context()->module()->annotation_begin(),
            itEnd = context()->module()->annotation_end();
       it != itEnd; ++it) {
    if (isMemberOffsetDecoration(*it)) {
      // Found first member decoration with offset, we expect all other
      // offsets right after the first one
      uint32_t prevMemberIndex = 0;
      uint32_t currentOffset = 0;
      uint32_t padAlignment = 1;
      do {
        const uint32_t memberIndex = it->GetOperand(1).words[0];
        if (memberIndex < prevMemberIndex) {
          // Failure: we expect all members to appear in consecutive order
          return Status::Failure;
        }

        // Apply alignment rules to current offset
        const analysis::Type& memberType = *structMemberTypes[memberIndex];
        uint32_t packedAlignment = getPackedAlignment(memberType);
        uint32_t packedSize = getPackedSize(memberType);

        if (isPackingHlsl(packingRules_)) {
          // If a member crosses vec4 boundaries, alignment is size of vec4
          if (currentOffset / 16 != (currentOffset + packedSize - 1) / 16)
            packedAlignment = std::max<uint32_t>(packedAlignment, 16u);
        }

        const uint32_t alignment =
            std::max<uint32_t>(packedAlignment, padAlignment);
        currentOffset = alignPow2(currentOffset, alignment);
        padAlignment = getPadAlignment(memberType, packedAlignment);

        // Override packed offset in instruction
        if (it->GetOperand(3).words[0] < currentOffset) {
          // Failure: packing resulted in higher offset for member than
          // previously generated
          return Status::Failure;
        }

        it->GetOperand(3).words[0] = currentOffset;
        modified = true;

        // Move to next member
        ++it;
        prevMemberIndex = memberIndex;
        currentOffset += packedSize;
      } while (it != itEnd && isMemberOffsetDecoration(*it));

      // We're done with all decorations for the struct of interest
      break;
    }
  }

  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}